

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O0

void __thiscall cnn::ComputationGraph::ComputationGraph(ComputationGraph *this)

{
  pointer pTVar1;
  runtime_error *this_00;
  SimpleExecutionEngine *in_RDI;
  ComputationGraph *in_stack_ffffffffffffffb8;
  SimpleExecutionEngine *this_01;
  
  this_01 = in_RDI;
  std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::vector
            ((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)0x5d9780);
  std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::vector
            ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)0x5d9793);
  pTVar1 = (pointer)operator_new(0x48);
  SimpleExecutionEngine::SimpleExecutionEngine(this_01,in_stack_ffffffffffffffb8);
  (in_RDI->ndEdfs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_finish = pTVar1;
  n_hgs = n_hgs + 1;
  if (1 < n_hgs) {
    std::operator<<((ostream *)&std::cerr,
                    "Memory allocator assumes only a single ComputationGraph at a time.\n");
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Attempted to create >1 CG");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

ComputationGraph::ComputationGraph() :
  ee(new SimpleExecutionEngine(*this)) {
  ++n_hgs;
  if (n_hgs > 1) {
    cerr << "Memory allocator assumes only a single ComputationGraph at a time.\n";
    throw std::runtime_error("Attempted to create >1 CG");
  }
}